

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndPopup(void)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *window;
  
  pIVar1 = GetCurrentWindow();
  if ((pIVar1->Flags & 0x2000000U) == 0) {
    __assert_fail("window->Flags & ImGuiWindowFlags_Popup",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0xdc2,"void ImGui::EndPopup()");
  }
  if (0 < (GImGui->CurrentPopupStack).Size) {
    End();
    if ((pIVar1->Flags & 0x4000000U) == 0) {
      PopStyleVar(1);
    }
    return;
  }
  __assert_fail("GImGui->CurrentPopupStack.Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                ,0xdc3,"void ImGui::EndPopup()");
}

Assistant:

void ImGui::EndPopup()
{
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(window->Flags & ImGuiWindowFlags_Popup);  // Mismatched BeginPopup()/EndPopup() calls
    IM_ASSERT(GImGui->CurrentPopupStack.Size > 0);
    ImGui::End();
    if (!(window->Flags & ImGuiWindowFlags_Modal))
        ImGui::PopStyleVar();
}